

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * __thiscall
duckdb::QueryProfiler::GetSaveLocation_abi_cxx11_
          (string *__return_storage_ptr__,QueryProfiler *this)

{
  if (this->is_explain_analyze == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&(this->context->config).profiler_save_location);
  }
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::GetSaveLocation() const {
	return is_explain_analyze ? string() : ClientConfig::GetConfig(context).profiler_save_location;
}